

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int archive_read_format_iso9660_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  void *pvVar2;
  undefined8 *in_RCX;
  long *in_RDX;
  long *in_RSI;
  archive *in_RDI;
  int64_t step;
  iso9660 *iso9660;
  ssize_t bytes_read;
  size_t in_stack_ffffffffffffffb8;
  archive_read *in_stack_ffffffffffffffc0;
  long local_30;
  int local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(long *)(lVar1 + 0xe0) != 0) {
    __archive_read_consume(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    *(undefined8 *)(lVar1 + 0xe0) = 0;
  }
  if (*(long *)(lVar1 + 0xd8) < 1) {
    if (*(long *)(lVar1 + 0x1e0) != 0) {
      *(undefined8 *)(lVar1 + 0x1e0) = *(undefined8 *)(*(long *)(lVar1 + 0x1e0) + 0x10);
    }
    if (*(long *)(lVar1 + 0x1e0) == 0) {
      *in_RSI = 0;
      *in_RDX = 0;
      *in_RCX = *(undefined8 *)(lVar1 + 0xd0);
      return 1;
    }
    if (*(ulong *)(lVar1 + 0xa0) < **(ulong **)(lVar1 + 0x1e0)) {
      in_stack_ffffffffffffffc0 =
           (archive_read *)
           __archive_read_consume
                     ((archive_read *)(**(long **)(lVar1 + 0x1e0) - *(long *)(lVar1 + 0xa0)),
                      in_stack_ffffffffffffffb8);
      if ((long)in_stack_ffffffffffffffc0 < 0) {
        return (int)in_stack_ffffffffffffffc0;
      }
      *(undefined8 *)(lVar1 + 0xa0) = **(undefined8 **)(lVar1 + 0x1e0);
    }
    if (**(ulong **)(lVar1 + 0x1e0) < *(ulong *)(lVar1 + 0xa0)) {
      archive_set_error(in_RDI,-1,"Ignoring out-of-order file (%s) %jd < %jd",
                        *(undefined8 *)(lVar1 + 0x10),**(undefined8 **)(lVar1 + 0x1e0),
                        *(undefined8 *)(lVar1 + 0xa0));
      *in_RSI = 0;
      *in_RDX = 0;
      *in_RCX = *(undefined8 *)(lVar1 + 0xd0);
      return -0x14;
    }
    *(undefined8 *)(lVar1 + 0xd8) = *(undefined8 *)(*(long *)(lVar1 + 0x1e0) + 8);
  }
  if (*(int *)(lVar1 + 0xe8) == 0) {
    pvVar2 = __archive_read_ahead
                       (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(ssize_t *)0x14addb);
    *in_RSI = (long)pvVar2;
    if (local_30 == 0) {
      archive_set_error(in_RDI,-1,"Truncated input file");
    }
    if (*in_RSI == 0) {
      local_4 = -0x1e;
    }
    else {
      if (*(long *)(lVar1 + 0xd8) < local_30) {
        local_30 = *(long *)(lVar1 + 0xd8);
      }
      *in_RDX = local_30;
      *in_RCX = *(undefined8 *)(lVar1 + 0xd0);
      *(long *)(lVar1 + 0xd0) = local_30 + *(long *)(lVar1 + 0xd0);
      *(long *)(lVar1 + 0xd8) = *(long *)(lVar1 + 0xd8) - local_30;
      *(long *)(lVar1 + 0xe0) = local_30;
      *(long *)(lVar1 + 0xa0) = local_30 + *(long *)(lVar1 + 0xa0);
      local_4 = 0;
    }
  }
  else {
    local_4 = zisofs_read_data((archive_read *)size,(void **)offset,(size_t *)bytes_read,
                               (int64_t *)iso9660);
  }
  return local_4;
}

Assistant:

static int
archive_read_format_iso9660_read_data(struct archive_read *a,
    const void **buff, size_t *size, int64_t *offset)
{
	ssize_t bytes_read;
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}

	if (iso9660->entry_bytes_remaining <= 0) {
		if (iso9660->entry_content != NULL)
			iso9660->entry_content = iso9660->entry_content->next;
		if (iso9660->entry_content == NULL) {
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_EOF);
		}
		/* Seek forward to the start of the entry. */
		if (iso9660->current_position < iso9660->entry_content->offset) {
			int64_t step;

			step = iso9660->entry_content->offset -
			    iso9660->current_position;
			step = __archive_read_consume(a, step);
			if (step < 0)
				return ((int)step);
			iso9660->current_position =
			    iso9660->entry_content->offset;
		}
		if (iso9660->entry_content->offset < iso9660->current_position) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Ignoring out-of-order file (%s) %jd < %jd",
			    iso9660->pathname.s,
			    (intmax_t)iso9660->entry_content->offset,
			    (intmax_t)iso9660->current_position);
			*buff = NULL;
			*size = 0;
			*offset = iso9660->entry_sparse_offset;
			return (ARCHIVE_WARN);
		}
		iso9660->entry_bytes_remaining = iso9660->entry_content->size;
	}
	if (iso9660->entry_zisofs.pz)
		return (zisofs_read_data(a, buff, size, offset));

	*buff = __archive_read_ahead(a, 1, &bytes_read);
	if (bytes_read == 0)
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Truncated input file");
	if (*buff == NULL)
		return (ARCHIVE_FATAL);
	if (bytes_read > iso9660->entry_bytes_remaining)
		bytes_read = (ssize_t)iso9660->entry_bytes_remaining;
	*size = bytes_read;
	*offset = iso9660->entry_sparse_offset;
	iso9660->entry_sparse_offset += bytes_read;
	iso9660->entry_bytes_remaining -= bytes_read;
	iso9660->entry_bytes_unconsumed = bytes_read;
	iso9660->current_position += bytes_read;
	return (ARCHIVE_OK);
}